

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O3

void write_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  int iVar2;
  
  iVar2 = b->bits_left + -1;
  b->bits_left = iVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar2 & 0x1f));
    *b->p = *b->p | (byte)(1 << ((byte)b->bits_left & 0x1f));
    iVar2 = b->bits_left;
  }
  if (iVar2 != 0) {
    if (iVar2 == 8) {
      return;
    }
    do {
      iVar2 = iVar2 + -1;
      b->bits_left = iVar2;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar2 & 0x1f));
        iVar2 = b->bits_left;
      }
      if (iVar2 == 8) {
        return;
      }
    } while (iVar2 != 0);
  }
  b->p = b->p + 1;
  b->bits_left = 8;
  return;
}

Assistant:

void write_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    write_rbsp_trailing_bits(h, b);

    if( h->pps->entropy_coding_mode_flag )
    {
        /*
        // 9.3.4.6 Byte stuffing process (informative)
        // NOTE do not write any cabac_zero_word for now - this appears to be optional
        while( more_rbsp_trailing_data(h, b) )
        {
            bs_write_f(b,16, 0x0000); // cabac_zero_word
        }
        */
    }
}